

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O3

uint fl_utf8toa(char *src,uint srclen,char *dst,uint dstlen)

{
  ulong uVar1;
  char cVar2;
  uint uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  byte *end;
  wchar_t len_1;
  wchar_t len;
  undefined8 local_38;
  
  end = (byte *)(src + srclen);
  local_38 = in_RAX;
  if (dstlen != 0) {
    uVar1 = 0;
    do {
      uVar4 = uVar1;
      if (end <= src) {
        dst[uVar4] = '\0';
        return (uint)uVar4;
      }
      if ((byte)*src < 0xc2) {
        dst[uVar4] = *src;
        src = (char *)((byte *)src + 1);
      }
      else {
        uVar3 = fl_utf8decode(src,(char *)end,(wchar_t *)((long)&local_38 + 4));
        src = (char *)((byte *)src + local_38._4_4_);
        cVar2 = (char)uVar3;
        if (0xff < uVar3) {
          cVar2 = '?';
        }
        dst[uVar4] = cVar2;
      }
      uVar1 = uVar4 + 1;
    } while ((ulong)dstlen != uVar4 + 1);
    dst[uVar4] = '\0';
  }
  while (src < end) {
    if (*src < '\0') {
      fl_utf8decode(src,(char *)end,(wchar_t *)&local_38);
      src = (char *)((byte *)src + (wchar_t)local_38);
    }
    else {
      src = (char *)((byte *)src + 1);
    }
    dstlen = dstlen + 1;
  }
  return dstlen;
}

Assistant:

unsigned fl_utf8toa(const char* src, unsigned srclen,
		 char* dst, unsigned dstlen)
{
  const char* p = src;
  const char* e = src+srclen;
  unsigned count = 0;
  if (dstlen) for (;;) {
    unsigned char c;
    if (p >= e) {dst[count] = 0; return count;}
    c = *(const unsigned char*)p;
    if (c < 0xC2) { /* ascii or bad code */
      dst[count] = c;
      p++;
    } else {
      int len; unsigned ucs = fl_utf8decode(p,e,&len);
      p += len;
      if (ucs < 0x100) dst[count] = ucs;
      else dst[count] = '?';
    }
    if (++count >= dstlen) {dst[count-1] = 0; break;}
  }
  /* we filled dst, measure the rest: */
  while (p < e) {
    if (!(*p & 0x80)) p++;
    else {
      int len;
      fl_utf8decode(p,e,&len);
      p += len;
    }
    ++count;
  }
  return count;
}